

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O3

void test_write_three_buffers_two_partial_writes(void)

{
  cio_buffered_stream *buffered_stream;
  int iVar1;
  cio_error cVar2;
  memory_stream *ms;
  int dummy_context;
  cio_write_buffer wb3;
  undefined1 local_9c [4];
  cio_write_buffer local_98;
  cio_write_buffer local_78;
  undefined1 local_58 [24];
  undefined8 local_40;
  cio_write_buffer local_38;
  
  ms = (memory_stream *)malloc(0x100);
  local_78.prev = (cio_write_buffer *)local_58;
  local_58._16_8_ = "HelloHelloHello";
  local_40 = 5;
  local_98.prev = &local_78;
  local_78.data.head.q_len = (long)"HelloHelloHello" + 5;
  local_78.data.element.length = 5;
  local_78.next = &local_98;
  local_98.data.head.q_len = (long)"HelloHelloHello" + 10;
  local_98.data.element.length = 5;
  local_38.data.head.q_len = 3;
  local_38.data.element.length = 0xf;
  local_98.next = &local_38;
  local_58._0_8_ = local_98.prev;
  local_58._8_8_ = &local_38;
  local_38.next = local_78.prev;
  local_38.prev = local_78.next;
  iVar1 = memory_stream_init(ms,"");
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x52d,UNITY_DISPLAY_STYLE_INT);
  write_some_fake.custom_fake = write_some_first_and_second_write_partial;
  UnityAssertEqualNumber
            (0,0,"Read buffer was not initialized correctly!",0x533,UNITY_DISPLAY_STYLE_INT);
  buffered_stream = (cio_buffered_stream *)(ms + 1);
  cVar2 = cio_buffered_stream_init(buffered_stream,(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Buffer was not initialized correctly!",0x536,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_write(buffered_stream,&local_38,dummy_write_handler,local_9c);
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x538,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_close(buffered_stream);
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x53b,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x53c,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)dummy_write_handler_fake.call_count,"Handler was not called!",0x53d,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)buffered_stream,(UNITY_INT)dummy_write_handler_fake.arg0_val,
             "Handler was not called with original buffered_stream!",0x53e,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)local_9c,(UNITY_INT)dummy_write_handler_fake.arg1_val,
             "Handler was not called with correct context!",0x53f,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)dummy_write_handler_fake.arg2_val,"Handler was not called with CIO_SUCCESS!",
             0x540,UNITY_DISPLAY_STYLE_INT);
  if (CONCAT71(write_check_buffer._8_7_,write_check_buffer[7]) == 0x6f6c6c65486f6c6c &&
      CONCAT17(write_check_buffer[7],write_check_buffer._0_7_) == 0x6c65486f6c6c6548) {
    return;
  }
  UnityFail("Data was not written correctly!",0x541);
}

Assistant:

static void test_write_three_buffers_two_partial_writes(void)
{
#define test_data_chunk "Hello"
	static const char test_data[] = test_data_chunk test_data_chunk test_data_chunk;
	struct client *client = malloc(sizeof(*client));
	int dummy_context;

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);
	struct cio_write_buffer wb1;
	cio_write_buffer_const_element_init(&wb1, test_data, strlen(test_data_chunk));
	cio_write_buffer_queue_tail(&wbh, &wb1);
	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, test_data + (strlen(test_data_chunk)), strlen(test_data_chunk));
	cio_write_buffer_queue_tail(&wbh, &wb2);
	struct cio_write_buffer wb3;
	cio_write_buffer_const_element_init(&wb3, test_data + (2 * (strlen(test_data_chunk))), strlen(test_data_chunk));
	cio_write_buffer_queue_tail(&wbh, &wb3);

	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, ""), "Could not allocate memory for test!");
	write_some_fake.custom_fake = write_some_first_and_second_write_partial;

	uint8_t buffer[40];
	struct cio_read_buffer rb;
	enum cio_error err = cio_read_buffer_init(&rb, &buffer, sizeof(buffer));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Read buffer was not initialized correctly!");

	err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");
	err = cio_buffered_stream_write(&client->bs, &wbh, dummy_write_handler, &dummy_context);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
	TEST_ASSERT_EQUAL_MESSAGE(1, dummy_write_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(&client->bs, dummy_write_handler_fake.arg0_val, "Handler was not called with original buffered_stream!");
	TEST_ASSERT_EQUAL_MESSAGE(&dummy_context, dummy_write_handler_fake.arg1_val, "Handler was not called with correct context!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_write_handler_fake.arg2_val, "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_MESSAGE(memcmp((const char *)write_check_buffer, test_data, strlen(test_data)) == 0, "Data was not written correctly!");
}